

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O3

ListReader * __thiscall
capnp::_::OrphanBuilder::asListReader
          (ListReader *__return_storage_ptr__,OrphanBuilder *this,ElementSize elementSize)

{
  SegmentBuilder **ppSVar1;
  short sVar2;
  ushort uVar3;
  StructPointerCount SVar4;
  CapTableReader *pCVar5;
  ReadLimiter *pRVar6;
  word *pwVar7;
  Arena *pAVar8;
  size_t sVar9;
  int iVar10;
  uint uVar11;
  undefined4 extraout_var;
  ulong uVar12;
  undefined4 extraout_var_00;
  SegmentReader **ppSVar13;
  ElementSize EVar14;
  ulong uVar15;
  uint uVar16;
  long lVar17;
  SegmentReader **ppSVar18;
  char *pcVar19;
  char *macroArgs;
  ulong uVar20;
  SegmentBuilder **ppSVar21;
  OrphanBuilder *pOVar22;
  DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *pDVar23;
  bool bVar24;
  DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> _kjCondition;
  SegmentReader *newSegment;
  SegmentBuilder *local_50;
  Fault f_2;
  WirePointerCount expectedPointersPerElement;
  uint pointerCount;
  BitCount expectedDataBitsPerElement;
  
  local_50 = this->segment;
  pCVar5 = &this->capTable->super_CapTableReader;
  ppSVar21 = (SegmentBuilder **)this->location;
  uVar11 = (uint)(this->tag).content;
  if (*(int *)((long)&(this->tag).content + 4) == 0 && uVar11 == 0) goto LAB_001837a4;
  if ((uVar11 & 3) == 2 && local_50 != (SegmentBuilder *)0x0) {
    iVar10 = (*((local_50->super_SegmentReader).arena)->_vptr_Arena[2])();
    local_50 = (SegmentBuilder *)CONCAT44(extraout_var,iVar10);
    _kjCondition.left = (SegmentReader **)&local_50;
    _kjCondition.right = (void *)0x0;
    _kjCondition.op.content.ptr = " != ";
    _kjCondition.op.content.size_ = 5;
    _kjCondition.result = local_50 != (SegmentBuilder *)0x0;
    if (local_50 == (SegmentBuilder *)0x0) {
      pDVar23 = (DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *)&newSegment;
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::SegmentReader*&,decltype(nullptr)>&,char_const(&)[49]>
                ((Fault *)pDVar23,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x244,FAILED,"segment != nullptr",
                 "_kjCondition,\"Message contains far pointer to unknown segment.\"",&_kjCondition,
                 (char (*) [49])"Message contains far pointer to unknown segment.");
    }
    else {
      uVar11 = (uint)(this->tag).content;
      uVar20 = (ulong)(uVar11 >> 3);
      uVar12 = (local_50->super_SegmentReader).ptr.size_;
      if ((long)uVar12 < (long)uVar20) {
        uVar20 = uVar12;
      }
      uVar15 = 2 - (ulong)((uVar11 & 4) == 0);
      if (uVar15 + uVar20 <= uVar12) {
        pOVar22 = (OrphanBuilder *)((local_50->super_SegmentReader).ptr.ptr + uVar20);
        pRVar6 = (local_50->super_SegmentReader).readLimiter;
        uVar12 = pRVar6->limit;
        if (uVar15 <= uVar12) {
          pRVar6->limit = uVar12 - uVar15;
          if (((this->tag).content & 4) != 0) {
            pAVar8 = (local_50->super_SegmentReader).arena;
            iVar10 = (*pAVar8->_vptr_Arena[2])
                               (pAVar8,(ulong)*(uint *)((long)&(pOVar22->tag).content + 4));
            newSegment = (SegmentReader *)CONCAT44(extraout_var_00,iVar10);
            _kjCondition.left = &newSegment;
            _kjCondition.right = (void *)0x0;
            _kjCondition.op.content.ptr = " != ";
            _kjCondition.op.content.size_ = 5;
            _kjCondition.result = (SegmentBuilder *)newSegment != (SegmentBuilder *)0x0;
            if ((SegmentBuilder *)newSegment == (SegmentBuilder *)0x0) {
              kj::_::Debug::Fault::
              Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::SegmentReader*&,decltype(nullptr)>&,char_const(&)[56]>
                        (&f_2,
                         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                         ,0x25f,FAILED,"newSegment != nullptr",
                         "_kjCondition,\"Message contains double-far pointer to unknown segment.\"",
                         &_kjCondition,
                         (char (*) [56])"Message contains double-far pointer to unknown segment.");
LAB_00183cfa:
              ppSVar21 = (SegmentBuilder **)0x0;
              kj::_::Debug::Fault::~Fault(&f_2);
            }
            else {
              uVar11 = (uint)(pOVar22->tag).content & 3;
              _kjCondition.left = (SegmentReader **)CONCAT44(2,uVar11);
              _kjCondition.right = " == ";
              _kjCondition.op.content.ptr = (char *)0x5;
              _kjCondition.op.content.size_ = (size_t)(uVar11 == 2);
              if (uVar11 != 2) {
                kj::_::Debug::Fault::
                Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[51]>
                          (&f_2,
                           "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                           ,0x263,FAILED,"pad->kind() == WirePointer::FAR",
                           "_kjCondition,\"Second word of double-far pad must be far pointer.\"",
                           (DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind>
                            *)&_kjCondition,
                           (char (*) [51])"Second word of double-far pad must be far pointer.");
                goto LAB_00183cfa;
              }
              uVar12 = (ulong)((uint)(pOVar22->tag).content >> 3);
              sVar9 = (((SegmentBuilder *)newSegment)->super_SegmentReader).ptr.size_;
              if ((long)sVar9 < (long)uVar12) {
                uVar12 = sVar9;
              }
              ppSVar21 = (SegmentBuilder **)
                         ((((SegmentBuilder *)newSegment)->super_SegmentReader).ptr.ptr + uVar12);
              local_50 = (SegmentBuilder *)newSegment;
            }
            this = (OrphanBuilder *)&pOVar22->segment;
            goto LAB_00183673;
          }
          ppSVar1 = &pOVar22->segment;
          uVar11 = (uint)(pOVar22->tag).content;
          lVar17 = (long)((int)uVar11 >> 2);
          this = pOVar22;
          if ((local_50 != (SegmentBuilder *)0x0) &&
             ((pwVar7 = (local_50->super_SegmentReader).ptr.ptr,
              ppSVar21 = (SegmentBuilder **)(pwVar7 + (local_50->super_SegmentReader).ptr.size_),
              lVar17 < (long)pwVar7 - (long)ppSVar1 >> 3 ||
              ((long)ppSVar21 - (long)ppSVar1 >> 3 < lVar17)))) goto LAB_00183673;
          ppSVar21 = ppSVar1 + lVar17;
          goto LAB_00183680;
        }
        (*((local_50->super_SegmentReader).arena)->_vptr_Arena[3])();
      }
      newSegment = (SegmentReader *)((ulong)newSegment & 0xffffffffffffff00);
      pDVar23 = &_kjCondition;
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[318]>
                ((Fault *)pDVar23,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x24d,FAILED,"boundsCheck(segment, ptr, padWords)",
                 "_kjCondition,\"Message contains out-of-bounds far pointer. \" OUT_OF_BOUNDS_ERROR_DETAIL"
                 ,(DebugExpression<bool> *)&newSegment,
                 (char (*) [318])
                 "Message contains out-of-bounds far pointer. This usually indicates that the input data was corrupted, used a different encoding than specified (e.g. packed vs. non-packed), or was not a Cap\'n Proto message to begin with. Note that this error is NOT due to a schema mismatch; the input is invalid regardless of schema."
                );
    }
  }
  else {
LAB_00183673:
    if (ppSVar21 == (SegmentBuilder **)0x0) goto LAB_001837a4;
    uVar11 = (uint)(this->tag).content;
LAB_00183680:
    uVar11 = uVar11 & 3;
    _kjCondition.left = (SegmentReader **)CONCAT44(1,uVar11);
    _kjCondition.right = " == ";
    _kjCondition.op.content.ptr = (char *)0x5;
    _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,uVar11 == 1);
    if (uVar11 == 1) {
      uVar11 = *(uint *)((long)&(this->tag).content + 4);
      EVar14 = (ElementSize)uVar11 & INLINE_COMPOSITE;
      if (EVar14 == INLINE_COMPOSITE) {
        f_2.exception._0_4_ = uVar11 >> 3;
        if (local_50 != (SegmentBuilder *)0x0) {
          if (((long)ppSVar21 - (long)(local_50->super_SegmentReader).ptr.ptr >> 3) +
              (ulong)(uint)f_2.exception + 1 <= (local_50->super_SegmentReader).ptr.size_) {
            uVar12 = (ulong)(uint)f_2.exception + 1;
            pRVar6 = (local_50->super_SegmentReader).readLimiter;
            uVar20 = pRVar6->limit;
            if (uVar12 <= uVar20) {
              pRVar6->limit = uVar20 - uVar12;
              goto LAB_001839a4;
            }
            (*((local_50->super_SegmentReader).arena)->_vptr_Arena[3])();
          }
          pcVar19 = "boundsCheck(segment, ptr, wordCount + POINTER_SIZE_IN_WORDS)";
          iVar10 = 0x900;
LAB_001838dc:
          newSegment = (SegmentReader *)((ulong)newSegment & 0xffffffffffffff00);
          pDVar23 = &_kjCondition;
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[319]>
                    ((Fault *)&_kjCondition,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                     ,iVar10,FAILED,pcVar19,
                     "_kjCondition,\"Message contains out-of-bounds list pointer. \" OUT_OF_BOUNDS_ERROR_DETAIL"
                     ,(DebugExpression<bool> *)&newSegment,
                     (char (*) [319])
                     "Message contains out-of-bounds list pointer. This usually indicates that the input data was corrupted, used a different encoding than specified (e.g. packed vs. non-packed), or was not a Cap\'n Proto message to begin with. Note that this error is NOT due to a schema mismatch; the input is invalid regardless of schema."
                    );
LAB_00183d81:
          kj::_::Debug::Fault::~Fault((Fault *)pDVar23);
          goto LAB_00183d8d;
        }
LAB_001839a4:
        uVar11 = *(uint *)ppSVar21 & 3;
        _kjCondition.left = (SegmentReader **)(ulong)uVar11;
        _kjCondition.right = " == ";
        _kjCondition.op.content.ptr = (char *)0x5;
        _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,uVar11 == 0);
        if (uVar11 != 0) {
          pDVar23 = (DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *)&newSegment;
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[61]>
                    ((Fault *)pDVar23,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x907,FAILED,"tag->kind() == WirePointer::STRUCT",
                     "_kjCondition,\"INLINE_COMPOSITE lists of non-STRUCT type are not supported.\""
                     ,(DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> *)
                      &_kjCondition,
                     (char (*) [61])"INLINE_COMPOSITE lists of non-STRUCT type are not supported.");
          goto LAB_00183d81;
        }
        uVar11 = *(uint *)ppSVar21 >> 2 & 0x1fffffff;
        uVar12 = (ulong)uVar11;
        uVar16 = (uint)*(ushort *)((long)ppSVar21 + 6) + (uint)*(ushort *)((long)ppSVar21 + 4);
        ppSVar18 = (SegmentReader **)(uVar16 * uVar12);
        _kjCondition.right = &f_2;
        _kjCondition.op.content.ptr = " <= ";
        ppSVar13 = (SegmentReader **)(ulong)(uint)f_2.exception;
        _kjCondition.op.content.size_ = 5;
        bVar24 = (long)ppSVar18 - (long)ppSVar13 == 0;
        _kjCondition.result = ppSVar18 < ppSVar13 || bVar24;
        _kjCondition.left = ppSVar18;
        if (ppSVar18 >= ppSVar13 && !bVar24) {
          pDVar23 = (DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *)&newSegment;
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_int&>&,char_const(&)[57]>
                    ((Fault *)pDVar23,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x90f,FAILED,"upgradeBound<uint64_t>(size) * wordsPerElement <= wordCount",
                     "_kjCondition,\"INLINE_COMPOSITE list\'s elements overrun its word count.\"",
                     (DebugComparison<unsigned_long,_unsigned_int_&> *)&_kjCondition,
                     (char (*) [57])"INLINE_COMPOSITE list\'s elements overrun its word count.");
          goto LAB_00183d81;
        }
        if ((uVar16 == 0) && (local_50 != (SegmentBuilder *)0x0)) {
          pRVar6 = (local_50->super_SegmentReader).readLimiter;
          uVar20 = pRVar6->limit;
          if (uVar20 < uVar12) {
            asListReader();
            goto LAB_00183d8d;
          }
          pRVar6->limit = uVar20 - uVar12;
        }
        _kjCondition.left._2_6_ = (undefined6)((ulong)ppSVar18 >> 0x10);
        if (elementSize - 2 < 4) {
          sVar2 = *(short *)((long)ppSVar21 + 4);
          _kjCondition.left = (SegmentReader **)CONCAT62(_kjCondition.left._2_6_,sVar2);
          _kjCondition.left = (SegmentReader **)((ulong)_kjCondition.left & 0xffffffff);
          _kjCondition.right = anon_var_dwarf_19a5f6;
          _kjCondition.op.content.ptr = (char *)0x4;
          _kjCondition.op.content.size_ = (size_t)(sVar2 != 0);
          if (sVar2 == 0) {
            pDVar23 = (DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *)&newSegment;
            kj::_::Debug::Fault::
            Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_short,unsigned_int>&,char_const(&)[84]>
                      ((Fault *)pDVar23,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                       ,0x935,FAILED,"tag->structRef.dataSize.get() > ZERO * WORDS",
                       "_kjCondition,\"Schema mismatch: Expected a primitive list, but got a list of pointer-only \" \"structs.\""
                       ,(DebugComparison<unsigned_short,_unsigned_int> *)&_kjCondition,
                       (char (*) [84])
                       "Schema mismatch: Expected a primitive list, but got a list of pointer-only structs."
                      );
            goto LAB_00183d81;
          }
        }
        else if (elementSize == POINTER) {
          sVar2 = *(short *)((long)ppSVar21 + 6);
          _kjCondition.left = (SegmentReader **)CONCAT62(_kjCondition.left._2_6_,sVar2);
          _kjCondition.left = (SegmentReader **)((ulong)_kjCondition.left & 0xffffffff);
          _kjCondition.right = anon_var_dwarf_19a5f6;
          _kjCondition.op.content.ptr = (char *)0x4;
          _kjCondition.op.content.size_ = (size_t)(sVar2 != 0);
          if (sVar2 == 0) {
            pDVar23 = (DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *)&newSegment;
            kj::_::Debug::Fault::
            Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_short,unsigned_int>&,char_const(&)[79]>
                      ((Fault *)pDVar23,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                       ,0x93d,FAILED,"tag->structRef.ptrCount.get() > ZERO * POINTERS",
                       "_kjCondition,\"Schema mismatch: Expected a pointer list, but got a list of data-only \" \"structs.\""
                       ,(DebugComparison<unsigned_short,_unsigned_int> *)&_kjCondition,
                       (char (*) [79])
                       "Schema mismatch: Expected a pointer list, but got a list of data-only structs."
                      );
            goto LAB_00183d81;
          }
        }
        else if (elementSize == BIT) {
          pcVar19 = 
          "Schema mismatch: Found struct list where bit list was expected; upgrading boolean lists to structs is no longer supported."
          ;
          macroArgs = 
          "\"Found struct list where bit list was expected; upgrading boolean lists to structs \" \"is no longer supported.\""
          ;
          iVar10 = 0x92a;
          goto LAB_00183a64;
        }
        uVar3 = *(ushort *)((long)ppSVar21 + 4);
        SVar4 = *(StructPointerCount *)((long)ppSVar21 + 6);
        __return_storage_ptr__->segment = &local_50->super_SegmentReader;
        __return_storage_ptr__->capTable = pCVar5;
        __return_storage_ptr__->ptr = (byte *)(ppSVar21 + 1);
        __return_storage_ptr__->elementCount = uVar11;
        __return_storage_ptr__->step = uVar16 * 0x40;
        __return_storage_ptr__->structDataSize = (uint)uVar3 << 6;
        __return_storage_ptr__->structPointerCount = SVar4;
        __return_storage_ptr__->elementSize = INLINE_COMPOSITE;
LAB_00183e40:
        __return_storage_ptr__->nestingLimit = 0x7ffffffe;
        iVar10 = 1;
      }
      else {
        f_2.exception._0_4_ = *(uint *)(BITS_PER_ELEMENT_TABLE + ((ulong)uVar11 & 7) * 4);
        pointerCount = (uint)(EVar14 == POINTER);
        uVar12 = (ulong)(uVar11 >> 3);
        uVar16 = pointerCount * 0x40 + (uint)f_2.exception;
        if (local_50 != (SegmentBuilder *)0x0) {
          uVar20 = uVar16 * uVar12 + 0x3f >> 6 & 0xffffffff;
          if (((long)ppSVar21 - (long)(local_50->super_SegmentReader).ptr.ptr >> 3) + uVar20 <=
              (local_50->super_SegmentReader).ptr.size_) {
            pRVar6 = (local_50->super_SegmentReader).readLimiter;
            uVar15 = pRVar6->limit;
            if (uVar20 <= uVar15) {
              pRVar6->limit = uVar15 - uVar20;
              goto LAB_00183a23;
            }
            (*((local_50->super_SegmentReader).arena)->_vptr_Arena[3])();
          }
          pcVar19 = "boundsCheck(segment, ptr, wordCount)";
          iVar10 = 0x958;
          goto LAB_001838dc;
        }
LAB_00183a23:
        if ((uVar11 & 7) != 0) {
          if ((elementSize == BIT) || (EVar14 != BIT)) goto LAB_00183bd1;
          pcVar19 = 
          "Schema mismatch: Found bit list where struct list was expected; upgrading boolean lists to structs is no longer supported."
          ;
          macroArgs = 
          "\"Found bit list where struct list was expected; upgrading boolean lists to structs \" \"is no longer supported.\""
          ;
          iVar10 = 0x969;
LAB_00183a64:
          pDVar23 = &_kjCondition;
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[106]>
                    ((Fault *)&_kjCondition,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                     ,iVar10,FAILED,(char *)0x0,macroArgs,(char (*) [106])(pcVar19 + 0x11));
          goto LAB_00183d81;
        }
        if (local_50 == (SegmentBuilder *)0x0) {
LAB_00183bd1:
          expectedDataBitsPerElement =
               *(BitCount *)(BITS_PER_ELEMENT_TABLE + (ulong)elementSize * 4);
          _kjCondition.left = (SegmentReader **)&expectedDataBitsPerElement;
          expectedPointersPerElement = (WirePointerCount)(elementSize == POINTER);
          _kjCondition.right = &f_2;
          _kjCondition.result = expectedDataBitsPerElement <= (uint)f_2.exception;
          if ((uint)f_2.exception < expectedDataBitsPerElement) {
            pcVar19 = "expectedDataBitsPerElement <= dataSize";
            iVar10 = 0x979;
          }
          else {
            _kjCondition.result = EVar14 == POINTER || elementSize != POINTER;
            _kjCondition.left = (SegmentReader **)&expectedPointersPerElement;
            _kjCondition.right = &pointerCount;
            if (EVar14 == POINTER || elementSize != POINTER) {
              __return_storage_ptr__->segment = &local_50->super_SegmentReader;
              __return_storage_ptr__->capTable = pCVar5;
              __return_storage_ptr__->ptr = (byte *)ppSVar21;
              __return_storage_ptr__->elementCount = uVar11 >> 3;
              __return_storage_ptr__->step = uVar16;
              __return_storage_ptr__->structDataSize = (uint)f_2.exception;
              __return_storage_ptr__->structPointerCount = (ushort)(EVar14 == POINTER);
              __return_storage_ptr__->elementSize = EVar14;
              goto LAB_00183e40;
            }
            pcVar19 = "expectedPointersPerElement <= pointerCount";
            iVar10 = 0x97d;
          }
          _kjCondition.op.content.size_ = 5;
          _kjCondition.op.content.ptr = " <= ";
          pDVar23 = (DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *)&newSegment;
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,unsigned_int&>&,char_const(&)[72]>
                    ((Fault *)&newSegment,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                     ,iVar10,FAILED,pcVar19,
                     "_kjCondition,\"Schema mismatch: Message contained list with incompatible element type.\""
                     ,(DebugComparison<unsigned_int_&,_unsigned_int_&> *)&_kjCondition,
                     (char (*) [72])
                     "Schema mismatch: Message contained list with incompatible element type.");
          goto LAB_00183d81;
        }
        pRVar6 = (local_50->super_SegmentReader).readLimiter;
        uVar20 = pRVar6->limit;
        if (uVar12 <= uVar20) {
          pRVar6->limit = uVar20 - uVar12;
          goto LAB_00183bd1;
        }
        asListReader();
LAB_00183d8d:
        iVar10 = 2;
      }
      if (iVar10 != 2) {
        return __return_storage_ptr__;
      }
      goto LAB_001837a4;
    }
    pDVar23 = (DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *)&newSegment;
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[84]>
              ((Fault *)pDVar23,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
               ,0x8f3,FAILED,"ref->kind() == WirePointer::LIST",
               "_kjCondition,\"Schema mismatch: Message contains non-list pointer where list pointer was \" \"expected.\""
               ,(DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> *)
                &_kjCondition,
               (char (*) [84])
               "Schema mismatch: Message contains non-list pointer where list pointer was expected."
              );
  }
  kj::_::Debug::Fault::~Fault((Fault *)pDVar23);
LAB_001837a4:
  __return_storage_ptr__->ptr = (byte *)0x0;
  __return_storage_ptr__->elementCount = 0;
  __return_storage_ptr__->step = 0;
  __return_storage_ptr__->segment = (SegmentReader *)0x0;
  __return_storage_ptr__->capTable = (CapTableReader *)0x0;
  *(undefined8 *)((long)&__return_storage_ptr__->step + 2) = 0;
  __return_storage_ptr__->elementSize = elementSize;
  __return_storage_ptr__->nestingLimit = 0x7fffffff;
  return __return_storage_ptr__;
}

Assistant:

ListReader OrphanBuilder::asListReader(ElementSize elementSize) const {
  KJ_DASSERT(tagAsPtr()->isNull() == (location == nullptr));
  return WireHelpers::readListPointer(
      segment, capTable, tagAsPtr(), location, nullptr, elementSize, kj::maxValue);
}